

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  word *pwVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar8;
  ulong uVar9;
  int Fill;
  long lVar10;
  long lVar11;
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vInputs);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar7 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar7 != 2) && (uVar7 != 5)) {
      if (uVar7 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExtract.c"
                      ,0x121,
                      "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      __ptr = Abc_NtkShareSuperAnd(pObj,&p->nFoundGates);
      iVar1 = __ptr->nSize;
      lVar10 = (long)iVar1;
      if ((lVar10 < 2) || (p->nMultiSize <= iVar1)) {
        if (0 < iVar1) {
          pwVar5 = __ptr->pArray;
          lVar11 = 0;
          do {
            uVar9 = pwVar5[lVar11];
            uVar7 = (uint)uVar9;
            if (((int)uVar7 < 0) || (vInputs->nSize <= (int)uVar7)) goto LAB_002c4bfd;
            p_00 = (Vec_Int_t *)vInputs->pArray[uVar7 & 0x7fffffff];
            if (p_00 == (Vec_Int_t *)0x0) {
              p_00 = (Vec_Int_t *)malloc(0x10);
              p_00->nCap = 0x10;
              p_00->nSize = 0;
              piVar8 = (int *)malloc(0x40);
              p_00->pArray = piVar8;
              Vec_IntPush(p_00,uVar7);
              uVar9 = uVar9 >> 1 & 0x7fffffff;
              pVVar6 = p->pNtk->vObjs;
              if (pVVar6->nSize <= (int)uVar9) goto LAB_002c4bfd;
              Vec_IntPush(p_00,*(uint *)((long)pVVar6->pArray[uVar9] + 0x14) >> 0xc);
              if (p_00->nSize != 2) {
                __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExtract.c"
                              ,0x12d,
                              "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                             );
              }
              if (vInputs->nSize <= (int)uVar7) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
              }
              vInputs->pArray[uVar7 & 0x7fffffff] = p_00;
            }
            Vec_IntPush(p_00,p->vObj2Lit->nSize);
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
        iVar2 = *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x10);
        if (iVar2 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(p->vObj2Lit,((uint)pObj & 1) + iVar2 * 2);
      }
      if (0 < iVar1) {
        pwVar5 = __ptr->pArray;
        lVar11 = 0;
        do {
          uVar7 = (uint)pwVar5[lVar11];
          if ((int)uVar7 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar7 = uVar7 >> 1;
          pVVar6 = p->pNtk->vObjs;
          if (pVVar6->nSize <= (int)uVar7) {
LAB_002c4bfd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Abc_NtkTraverseSupersAnd_rec(p,(Abc_Obj_t *)pVVar6->pArray[uVar7],vInputs);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      if (__ptr->pArray != (word *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (word *)0x0;
      }
      if (__ptr != (Vec_Wrd_t *)0x0) {
        free(__ptr);
        return;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkTraverseSupersAnd_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    Vec_Wrd_t * vSuper;
    word Num;
    int k;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    vSuper = Abc_NtkShareSuperAnd( pObj, &p->nFoundGates );
    if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
    {
        Vec_WrdForEachEntry( vSuper, Num, k )
        {
            Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
            if ( vInput == NULL )
            {
                vInput = Vec_IntAlloc( 10 );
                Vec_IntPush( vInput, (int)Num );
                Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num))) );
                assert( SHARE_NUM == Vec_IntSize(vInput) );
                Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
            }
            Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
        }
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );
    }
    // call recursively
    Vec_WrdForEachEntry( vSuper, Num, k )
        Abc_NtkTraverseSupersAnd_rec( p, Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num)), vInputs );
    Vec_WrdFree( vSuper );
}